

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_U_invmult_inplace_p(m256v *LU,int rank,m256v *X_inout,int *placements)

{
  ulong uVar1;
  bool bVar2;
  uint8_t alpha;
  int rt;
  ulong uVar3;
  ulong uVar4;
  int r1;
  ulong uVar5;
  
  if (0 < rank) {
    uVar4 = (ulong)(uint)rank;
    uVar3 = uVar4;
    do {
      uVar4 = uVar4 - 1;
      uVar1 = uVar3 - 1;
      if (placements == (int *)0x0) {
        rt = (int)uVar1;
      }
      else {
        rt = placements[uVar1];
      }
      uVar5 = uVar3;
      if ((long)uVar3 < (long)LU->n_col) {
        do {
          if (placements == (int *)0x0) {
            r1 = (int)uVar5;
          }
          else {
            r1 = placements[uVar5];
          }
          m256v_multadd_row_from(X_inout,r1,0,LU->e[uVar5 + LU->rstride * uVar4],X_inout,rt);
          uVar5 = uVar5 + 1;
        } while ((int)uVar5 < LU->n_col);
      }
      alpha = gf256_inv(LU->e[(uVar3 - 1) + LU->rstride * uVar1]);
      m256v_mult_row(X_inout,rt,alpha);
      bVar2 = 1 < (long)uVar3;
      uVar3 = uVar1;
    } while (bVar2);
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}